

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.hpp
# Opt level: O2

string * __thiscall
pstore::base32::convert<pstore::uint128>(string *__return_storage_ptr__,base32 *this,uint128 val)

{
  uint128 wide;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  undefined8 unaff_RBX;
  undefined8 unaff_R14;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  wide.v_._8_8_ = unaff_R14;
  wide.v_._0_8_ = unaff_RBX;
  convert<std::back_insert_iterator<std::__cxx11::string>>(this,wide,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

std::string convert (IntType val) {
            std::string result;
            auto const max_length = 26;
            PSTORE_ASSERT (std::pow (32.0, max_length) >= std::pow (2.0, 128));
            result.reserve (max_length);
            convert (val, std::back_inserter (result));
            return result;
        }